

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAtom.cpp
# Opt level: O3

void __thiscall OpenMD::DirectionalAtom::rotateBy(DirectionalAtom *this,RotMat3x3d *m)

{
  uint i;
  long lVar1;
  double (*padVar2) [3];
  long lVar3;
  double (*padVar4) [3];
  uint k;
  long lVar5;
  double dVar6;
  SquareMatrix3<double> result;
  double local_a8 [18];
  
  StuntDouble::getA((RotMat3x3d *)(local_a8 + 9),(StuntDouble *)this);
  local_a8[6] = 0.0;
  local_a8[7] = 0.0;
  local_a8[4] = 0.0;
  local_a8[5] = 0.0;
  local_a8[2] = 0.0;
  local_a8[3] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[8] = 0.0;
  lVar1 = 0;
  do {
    lVar3 = 0;
    padVar2 = (double (*) [3])(local_a8 + 9);
    do {
      dVar6 = local_a8[lVar1 * 3 + lVar3];
      lVar5 = 0;
      padVar4 = padVar2;
      do {
        dVar6 = dVar6 + (((SquareMatrix<double,_3> *)*(double (*) [3])m)->
                        super_RectMatrix<double,_3U,_3U>).data_[0][lVar5] *
                        (((SquareMatrix<double,_3> *)*padVar4)->super_RectMatrix<double,_3U,_3U>).
                        data_[0][0];
        lVar5 = lVar5 + 1;
        padVar4 = padVar4 + 1;
      } while (lVar5 != 3);
      local_a8[lVar1 * 3 + lVar3] = dVar6;
      lVar3 = lVar3 + 1;
      padVar2 = (double (*) [3])(*padVar2 + 1);
    } while (lVar3 != 3);
    lVar1 = lVar1 + 1;
    m = (RotMat3x3d *)((long)m + 0x18);
  } while (lVar1 != 3);
  (*(this->super_Atom).super_StuntDouble._vptr_StuntDouble[3])(this,local_a8);
  return;
}

Assistant:

void DirectionalAtom::rotateBy(const RotMat3x3d& m) { setA(m * getA()); }